

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_options.c
# Opt level: O2

int archive_set_filter_option(archive *_a,char *m,char *o,char *v)

{
  archive_string_conv *paVar1;
  code *pcVar2;
  int iVar3;
  int iVar4;
  archive_string_conv **ppaVar5;
  
  ppaVar5 = &_a[1].sconv;
  iVar4 = -0x14;
  do {
    paVar1 = *ppaVar5;
    if (paVar1 == (archive_string_conv *)0x0) {
      iVar3 = -0x15;
      if (iVar4 != -0x14) {
        iVar3 = iVar4;
      }
      if (m == (char *)0x0) {
        iVar3 = iVar4;
      }
      return iVar3;
    }
    pcVar2 = *(code **)&paVar1->from_cp;
    if ((pcVar2 != (code *)0x0) &&
       ((m == (char *)0x0 || (iVar3 = strcmp((char *)paVar1->converter[0],m), iVar3 == 0)))) {
      iVar3 = (*pcVar2)(paVar1,o,v);
      if (m != (char *)0x0) {
        return iVar3;
      }
      if (iVar3 == -0x1e) {
        return -0x1e;
      }
      if (iVar3 == 0) {
        iVar4 = 0;
      }
    }
    ppaVar5 = (archive_string_conv **)&paVar1->to_charset;
  } while( true );
}

Assistant:

static int
archive_set_filter_option(struct archive *_a, const char *m, const char *o,
    const char *v)
{
	struct archive_write *a = (struct archive_write *)_a;
	struct archive_write_filter *filter;
	int r, rv = ARCHIVE_WARN;

	for (filter = a->filter_first; filter != NULL; filter = filter->next_filter) {
		if (filter->options == NULL)
			continue;
		if (m != NULL && strcmp(filter->name, m) != 0)
			continue;

		r = filter->options(filter, o, v);

		if (r == ARCHIVE_FATAL)
			return (ARCHIVE_FATAL);

		if (m != NULL)
			return (r);

		if (r == ARCHIVE_OK)
			rv = ARCHIVE_OK;
	}
	/* If the filter name didn't match, return a special code for
	 * _archive_set_option[s]. */
	if (rv == ARCHIVE_WARN && m != NULL)
		rv = ARCHIVE_WARN - 1;
	return (rv);
}